

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_ea_mode(CPUM68KState_conflict *env,DisasContext_conflict2 *s,int mode,int reg0,
                    int opsize,TCGv_i32 val,TCGv_i32 *addrp,ea_what what,int index)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  TCGv_i32 ret;
  TCGv_i32 pTVar5;
  TCGv_i32 tmp_1;
  int32_t offset;
  TCGv_i32 result;
  TCGv_i32 tmp;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 val_local;
  int opsize_local;
  int reg0_local;
  int mode_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  switch(mode) {
  case 0:
    if (what == EA_STORE) {
      gen_partset_reg(tcg_ctx_00,opsize,tcg_ctx_00->cpu_dregs[reg0],val);
      env_local = (CPUM68KState_conflict *)tcg_ctx_00->store_dummy;
    }
    else {
      env_local = (CPUM68KState_conflict *)
                  gen_extend(s,tcg_ctx_00->cpu_dregs[reg0],opsize,(uint)(what == EA_LOADS));
    }
    break;
  case 1:
    pTVar5 = get_areg(s,reg0);
    if (what == EA_STORE) {
      tcg_gen_mov_i32(tcg_ctx_00,pTVar5,val);
      env_local = (CPUM68KState_conflict *)tcg_ctx_00->store_dummy;
    }
    else {
      env_local = (CPUM68KState_conflict *)gen_extend(s,pTVar5,opsize,(uint)(what == EA_LOADS));
    }
    break;
  case 2:
    pTVar5 = get_areg(s,reg0);
    env_local = (CPUM68KState_conflict *)gen_ldst(s,opsize,pTVar5,val,what,index);
    break;
  case 3:
    pTVar5 = get_areg(s,reg0);
    env_local = (CPUM68KState_conflict *)gen_ldst(s,opsize,pTVar5,val,what,index);
    if ((what == EA_STORE) || (addrp == (TCGv_i32 *)0x0)) {
      ret = tcg_temp_new_i32(tcg_ctx_00);
      if ((reg0 == 7) && ((opsize == 0 && (iVar4 = m68k_feature(s->env,0), iVar4 != 0)))) {
        tcg_gen_addi_i32_m68k(tcg_ctx_00,ret,pTVar5,2);
      }
      else {
        iVar4 = opsize_bytes(opsize);
        tcg_gen_addi_i32_m68k(tcg_ctx_00,ret,pTVar5,iVar4);
      }
      delay_set_areg(s,reg0,ret,true);
    }
    break;
  case 4:
    if ((addrp == (TCGv_i32 *)0x0) || (what != EA_STORE)) {
      result = gen_lea_mode(env,s,mode,reg0,opsize);
      if (result == tcg_ctx_00->NULL_QREG) {
        return result;
      }
      if (addrp != (TCGv_i32 *)0x0) {
        *addrp = result;
      }
    }
    else {
      result = *addrp;
    }
    env_local = (CPUM68KState_conflict *)gen_ldst(s,opsize,result,val,what,index);
    if ((what == EA_STORE) || (addrp == (TCGv_i32 *)0x0)) {
      delay_set_areg(s,reg0,result,false);
    }
    break;
  case 5:
  case 6:
    goto LAB_008cd2d2;
  case 7:
    if (3 < (uint)reg0) {
      if (reg0 != 4) {
        return tcg_ctx_00->NULL_QREG;
      }
      if (opsize == 0) {
        if (what == EA_LOADS) {
          uVar1 = read_im8(env,s);
          tmp_1._4_4_ = (uint32_t)(char)uVar1;
        }
        else {
          bVar2 = read_im8(env,s);
          tmp_1._4_4_ = (uint32_t)bVar2;
        }
      }
      else if (opsize == 1) {
        if (what == EA_LOADS) {
          uVar3 = read_im16(env,s);
          tmp_1._4_4_ = (uint32_t)(short)uVar3;
        }
        else {
          uVar3 = read_im16(env,s);
          tmp_1._4_4_ = (uint32_t)uVar3;
        }
      }
      else {
        if (opsize != 2) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                     ,0x3ca,(char *)0x0);
        }
        tmp_1._4_4_ = read_im32(env,s);
      }
      pTVar5 = tcg_const_i32_m68k(tcg_ctx_00,tmp_1._4_4_);
      pTVar5 = mark_to_release(s,pTVar5);
      return pTVar5;
    }
LAB_008cd2d2:
    if ((addrp == (TCGv_i32 *)0x0) || (what != EA_STORE)) {
      result = gen_lea_mode(env,s,mode,reg0,opsize);
      if (result == tcg_ctx_00->NULL_QREG) {
        return result;
      }
      if (addrp != (TCGv_i32 *)0x0) {
        *addrp = result;
      }
    }
    else {
      result = *addrp;
    }
    env_local = (CPUM68KState_conflict *)gen_ldst(s,opsize,result,val,what,index);
    break;
  default:
    env_local = (CPUM68KState_conflict *)tcg_ctx_00->NULL_QREG;
  }
  return (TCGv_i32)env_local;
}

Assistant:

static TCGv gen_ea_mode(CPUM68KState *env, DisasContext *s, int mode, int reg0,
                        int opsize, TCGv val, TCGv *addrp, ea_what what,
                        int index)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg, tmp, result;
    int32_t offset;

    switch (mode) {
    case 0: /* Data register direct.  */
        reg = tcg_ctx->cpu_dregs[reg0];
        if (what == EA_STORE) {
            gen_partset_reg(tcg_ctx, opsize, reg, val);
            return tcg_ctx->store_dummy;
        } else {
            return gen_extend(s, reg, opsize, what == EA_LOADS);
        }
    case 1: /* Address register direct.  */
        reg = get_areg(s, reg0);
        if (what == EA_STORE) {
            tcg_gen_mov_i32(tcg_ctx, reg, val);
            return tcg_ctx->store_dummy;
        } else {
            return gen_extend(s, reg, opsize, what == EA_LOADS);
        }
    case 2: /* Indirect register */
        reg = get_areg(s, reg0);
        return gen_ldst(s, opsize, reg, val, what, index);
    case 3: /* Indirect postincrement.  */
        reg = get_areg(s, reg0);
        result = gen_ldst(s, opsize, reg, val, what, index);
        if (what == EA_STORE || !addrp) {
            TCGv tmp = tcg_temp_new(tcg_ctx);
            if (reg0 == 7 && opsize == OS_BYTE &&
                m68k_feature(s->env, M68K_FEATURE_M68000)) {
                tcg_gen_addi_i32(tcg_ctx, tmp, reg, 2);
            } else {
                tcg_gen_addi_i32(tcg_ctx, tmp, reg, opsize_bytes(opsize));
            }
            delay_set_areg(s, reg0, tmp, true);
        }
        return result;
    case 4: /* Indirect predecrememnt.  */
        if (addrp && what == EA_STORE) {
            tmp = *addrp;
        } else {
            tmp = gen_lea_mode(env, s, mode, reg0, opsize);
            if (IS_NULL_QREG(tmp)) {
                return tmp;
            }
            if (addrp) {
                *addrp = tmp;
            }
        }
        result = gen_ldst(s, opsize, tmp, val, what, index);
        if (what == EA_STORE || !addrp) {
            delay_set_areg(s, reg0, tmp, false);
        }
        return result;
    case 5: /* Indirect displacement.  */
    case 6: /* Indirect index + displacement.  */
    do_indirect:
        if (addrp && what == EA_STORE) {
            tmp = *addrp;
        } else {
            tmp = gen_lea_mode(env, s, mode, reg0, opsize);
            if (IS_NULL_QREG(tmp)) {
                return tmp;
            }
            if (addrp) {
                *addrp = tmp;
            }
        }
        return gen_ldst(s, opsize, tmp, val, what, index);
    case 7: /* Other */
        switch (reg0) {
        case 0: /* Absolute short.  */
        case 1: /* Absolute long.  */
        case 2: /* pc displacement  */
        case 3: /* pc index+displacement.  */
            goto do_indirect;
        case 4: /* Immediate.  */
            /* Sign extend values for consistency.  */
            switch (opsize) {
            case OS_BYTE:
                if (what == EA_LOADS) {
                    offset = (int8_t)read_im8(env, s);
                } else {
                    offset = read_im8(env, s);
                }
                break;
            case OS_WORD:
                if (what == EA_LOADS) {
                    offset = (int16_t)read_im16(env, s);
                } else {
                    offset = read_im16(env, s);
                }
                break;
            case OS_LONG:
                offset = read_im32(env, s);
                break;
            default:
                g_assert_not_reached();
            }
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        default:
            return tcg_ctx->NULL_QREG;
        }
    }
    /* Should never happen.  */
    return tcg_ctx->NULL_QREG;
}